

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.cc
# Opt level: O3

void __thiscall gutil::Properties::saveOctave(Properties *this,ostream *out,char *comment)

{
  _Rb_tree_node_base *p_Var1;
  size_t sVar2;
  char *__s;
  shared_ptr<gutil::PropertyNode> root;
  undefined1 local_51;
  PropertyNode *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  __s = "Converted properties";
  if (comment != (char *)0x0) {
    __s = comment;
  }
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_50 = (PropertyNode *)0x0;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<gutil::PropertyNode,std::allocator<gutil::PropertyNode>,std::__cxx11::string>
            (&local_48,&local_50,(allocator<gutil::PropertyNode> *)&local_51,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  for (p_Var1 = (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->data)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    PropertyNode::addChild(local_50,(string *)(p_Var1 + 1),(string *)(p_Var1 + 2));
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"# ",2);
  sVar2 = strlen(__s);
  std::__ostream_insert<char,std::char_traits<char>>(out,__s,sVar2);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  PropertyNode::saveOctave(local_50,out);
  if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
  }
  return;
}

Assistant:

void Properties::saveOctave(std::ostream& out, const char *comment) const
{
  if (comment == 0)
  {
    comment="Converted properties";
  }

  std::shared_ptr<PropertyNode> root=std::make_shared<PropertyNode>(std::string());

  for (std::map<std::string, std::string>::const_iterator it=data.begin(); it!=data.end(); ++it)
  {
    root->addChild(it->first, it->second);
  }

  out << "# " << comment << std::endl;
  root->saveOctave(out);
}